

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_16_bit(char *filename)

{
  FILE *__stream;
  int result;
  FILE *f;
  FILE *in_stack_000000c0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  __stream = (FILE *)stbi__fopen((char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffd8);
  if (__stream == (FILE *)0x0) {
    local_4 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    local_4 = stbi_is_16_bit_from_file(in_stack_000000c0);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

STBIDEF int stbi_is_16_bit(char const *filename)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_is_16_bit_from_file(f);
    fclose(f);
    return result;
}